

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridLocalPolynomial.hpp
# Opt level: O1

Data2D<double> * __thiscall
TasGrid::GridLocalPolynomial::encodeSupportForGPU<1,(TasGrid::TypeOneDRule)40,double>
          (Data2D<double> *__return_storage_ptr__,GridLocalPolynomial *this,MultiIndexSet *work)

{
  int iVar1;
  uint uVar2;
  pointer piVar3;
  size_t sVar4;
  pointer pdVar5;
  size_t sVar6;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  int iVar10;
  double dVar11;
  allocator_type local_21;
  
  sVar6 = (size_t)(this->super_BaseCanonicalGrid).num_dimensions;
  iVar1 = work->cache_num_indexes;
  __return_storage_ptr__->stride = sVar6;
  __return_storage_ptr__->num_strips = (long)iVar1;
  ::std::vector<double,_std::allocator<double>_>::vector
            (&__return_storage_ptr__->vec,(long)iVar1 * sVar6,&local_21);
  iVar1 = work->cache_num_indexes;
  if (0 < (long)iVar1) {
    sVar6 = work->num_dimensions;
    piVar3 = (work->indexes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    sVar4 = __return_storage_ptr__->stride;
    pdVar5 = (__return_storage_ptr__->vec).super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar2 = (this->super_BaseCanonicalGrid).num_dimensions;
    lVar8 = 0;
    do {
      if (0 < (int)uVar2) {
        uVar9 = 0;
        do {
          iVar10 = piVar3[sVar6 * lVar8 + uVar9];
          dVar11 = 2.0;
          if (1 < iVar10) {
            dVar11 = 1.0;
            if (iVar10 != 2) {
              uVar7 = iVar10 - 1;
              iVar10 = 1;
              do {
                uVar7 = (int)uVar7 >> 1;
                iVar10 = iVar10 * 2;
              } while (1 < uVar7);
              dVar11 = (double)iVar10;
            }
            dVar11 = 1.0 / dVar11;
          }
          pdVar5[sVar4 * lVar8 + uVar9] = dVar11;
          uVar9 = uVar9 + 1;
        } while (uVar9 != uVar2);
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 != iVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

Data2D<T> encodeSupportForGPU(const MultiIndexSet &work) const{
        Data2D<T> cpu_support(num_dimensions, work.getNumIndexes());
        for(int i=0; i<work.getNumIndexes(); i++){
            const int* p = work.getIndex(i);
            T *s = cpu_support.getStrip(i);
            for(int j=0; j<num_dimensions; j++){
                if (ord == 0){
                    s[j] = static_cast<T>(RuleLocal::getSupport<RuleLocal::erule::pwc>(p[j]));
                } else {
                    switch(crule) {
                        case rule_localp:
                            s[j] = static_cast<T>(RuleLocal::getSupport<RuleLocal::erule::localp>(p[j]));
                            break;
                        case rule_semilocalp:
                            s[j] = static_cast<T>(RuleLocal::getSupport<RuleLocal::erule::semilocalp>(p[j]));
                            break;
                        case rule_localp0:
                            s[j] = static_cast<T>(RuleLocal::getSupport<RuleLocal::erule::localp0>(p[j]));
                            break;
                        case rule_localpb:
                            s[j] = static_cast<T>(RuleLocal::getSupport<RuleLocal::erule::localpb>(p[j]));
                            break;
                    };
                    if (ord == 2) s[j] *= s[j];
                    if ((crule == rule_localp) || (crule == rule_semilocalp)) if (p[j] == 0) s[j] = static_cast<T>(-1.0); // constant function
                    if ((crule == rule_localp) && (ord == 2)){
                        if (p[j] == 1) s[j] = static_cast<T>(-2.0);
                        else if (p[j] == 2) s[j] = static_cast<T>(-3.0);
                    }
                    if ((crule == rule_semilocalp) && (ord == 2)){
                        if (p[j] == 1) s[j] = static_cast<T>(-4.0);
                        else if (p[j] == 2) s[j] = static_cast<T>(-5.0);
                    }
                    if ((crule == rule_localpb) && (ord == 2)){
                        if (p[j] < 2) s[j] = static_cast<T>(-2.0); // linear functions on level 0
                    }
                }
            }
        }
        return cpu_support;
    }